

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionID.h
# Opt level: O3

void __thiscall FIX::SessionID::~SessionID(SessionID *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  pcVar2 = (this->m_frozenString)._M_dataplus._M_p;
  paVar1 = &(this->m_frozenString).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->m_sessionQualifier)._M_dataplus._M_p;
  paVar1 = &(this->m_sessionQualifier).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  FieldBase::~FieldBase((FieldBase *)&this->m_targetCompID);
  FieldBase::~FieldBase((FieldBase *)&this->m_senderCompID);
  FieldBase::~FieldBase((FieldBase *)this);
  return;
}

Assistant:

SessionID() { toString(m_frozenString); }